

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_reader.inl
# Opt level: O0

buffer_reader * __thiscall
buffer_reader::operator>>
          (buffer_reader *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *vector)

{
  reference data;
  ulong local_28;
  size_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvStack_18;
  buffer_collection_size size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *vector_local;
  buffer_reader *this_local;
  
  i._4_4_ = 0;
  pvStack_18 = vector;
  vector_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)this;
  operator>>(this,(uint32_t *)((long)&i + 4));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(pvStack_18,(ulong)i._4_4_);
  for (local_28 = 0; local_28 < i._4_4_; local_28 = local_28 + 1) {
    data = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](pvStack_18,local_28)
    ;
    operator>>(this,data);
  }
  return this;
}

Assistant:

inline buffer_reader& buffer_reader::operator>>(std::vector<T>& vector)
{
    buffer_collection_size size = 0;
    *this >> size;
    vector.resize(size);

    for(std::size_t i = 0; i < size; ++i)
    {
        *this >> vector[i];
    }

    return *this;
}